

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QString,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *this,QString *key)

{
  byte bVar1;
  size_t hash;
  uchar *puVar2;
  Bucket BVar3;
  QStringView key_00;
  
  key_00.m_data = (key->d).ptr;
  key_00.m_size = (key->d).size;
  hash = ::qHash(key_00,this->seed);
  BVar3 = findBucketWithHash<QString>(this,key,hash);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    puVar2 = (uchar *)0x0;
  }
  else {
    puVar2 = ((BVar3.span)->entries->storage).data + (uint)bVar1 * 0x18;
  }
  return (Node<QString,_QHashDummyValue> *)puVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }